

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram.c
# Opt level: O3

uint32_t Ngram_next_words(Ngram model,uint32_t *context,uint32_t context_len,
                         uint32_t next_word_limit,NextWordResult_T *rets)

{
  uint uVar1;
  uint32_t uVar2;
  int iVar3;
  LowGram_T *pLVar4;
  HighGram_T *pHVar5;
  void *__base;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  size_t __nmemb;
  ulong uVar16;
  bool bVar17;
  ulong local_38;
  
  if (context_len == 0) {
    local_38._0_4_ = 0;
  }
  else {
    uVar11 = (context_len - model->ngram_order) + 1;
    local_38._0_4_ = 0;
    if (context_len < model->ngram_order) {
      uVar11 = 0;
    }
    if (uVar11 < context_len) {
      uVar13 = (ulong)context_len;
      local_38 = 0;
      uVar10 = (ulong)uVar11;
      do {
        uVar7 = uVar10 + 1;
        if (uVar7 < uVar13) {
          uVar16 = (ulong)model->uni_gram[context[uVar10]].next_arr_idx;
          uVar11 = model->uni_gram[context[uVar10] + 1].next_arr_idx;
          uVar10 = uVar7;
          uVar15 = 0;
          do {
            uVar14 = uVar15;
            uVar11 = uVar11 - (int)uVar16;
            if (uVar11 == 0) goto LAB_00103225;
            uVar1 = context[uVar10];
            lVar12 = (ulong)uVar11 - 1;
            lVar9 = 0;
            while( true ) {
              uVar8 = (ulong)(lVar9 + lVar12) >> 1;
              uVar11 = model->low_grams[uVar14][uVar16 + uVar8].word;
              if (uVar11 == uVar1) break;
              if (uVar11 < uVar1 || uVar11 == uVar1) {
                lVar9 = uVar8 + 1;
              }
              else {
                lVar12 = uVar8 - 1;
              }
              if (lVar12 < lVar9) goto LAB_00103225;
            }
            if ((~(lVar9 + lVar12) & 0x1fffffffeU) == 0) goto LAB_00103225;
            uVar15 = uVar14 + 1;
            pLVar4 = model->low_grams[uVar15 & 0xffffffff];
            uVar10 = uVar10 + 1;
            uVar11 = pLVar4[(int)uVar8 + 1].next_arr_idx;
            uVar1 = pLVar4[uVar8 & 0xffffffff].next_arr_idx;
            uVar16 = (ulong)uVar1;
          } while (uVar10 < uVar13);
          if (uVar7 < uVar13) {
            uVar10 = (ulong)(uVar11 - uVar1);
            __base = malloc(uVar10 * 8);
            if ((int)uVar14 + 3U == model->ngram_order) {
              if (uVar11 != uVar1) {
                pHVar5 = model->high_gram;
                lVar9 = 0;
                __nmemb = 0;
                do {
                  uVar2 = pHVar5[uVar16 + lVar9].prob;
                  if (uVar2 != 0xffffffff) {
                    *(uint32_t *)((long)__base + __nmemb * 8) = pHVar5[uVar16 + lVar9].word;
                    *(uint32_t *)((long)__base + __nmemb * 8 + 4) = uVar2;
                    __nmemb = __nmemb + 1;
                  }
                  lVar9 = lVar9 + 1;
                } while (uVar10 + (uVar10 == 0) != lVar9);
                goto LAB_001031ba;
              }
LAB_00103150:
              qsort(__base,0,8,next_word_cmp);
            }
            else {
              if (uVar11 == uVar1) goto LAB_00103150;
              pLVar4 = model->low_grams[uVar15 & 0xffffffff];
              lVar9 = 0;
              __nmemb = 0;
              do {
                iVar3 = *(int *)((long)&pLVar4[uVar16].prob + lVar9);
                if (iVar3 != -1) {
                  *(undefined4 *)((long)__base + __nmemb * 8) =
                       *(undefined4 *)((long)&pLVar4[uVar16].word + lVar9);
                  *(int *)((long)__base + __nmemb * 8 + 4) = iVar3;
                  __nmemb = __nmemb + 1;
                }
                lVar9 = lVar9 + 0x10;
              } while ((uVar10 + (uVar10 == 0)) * 0x10 != lVar9);
LAB_001031ba:
              qsort(__base,__nmemb,8,next_word_cmp);
              if (__nmemb != 0) {
                sVar6 = 1;
                do {
                  uVar11 = (int)local_38 + 1;
                  rets[local_38] = *(NextWordResult_T *)((long)__base + sVar6 * 8 + -8);
                  if (next_word_limit <= uVar11) {
                    free(__base);
                    return next_word_limit;
                  }
                  bVar17 = sVar6 != __nmemb;
                  sVar6 = sVar6 + 1;
                  local_38 = (ulong)uVar11;
                } while (bVar17);
              }
            }
            free(__base);
          }
        }
LAB_00103225:
        uVar10 = uVar7;
      } while (uVar7 != uVar13);
    }
  }
  return (uint32_t)local_38;
}

Assistant:

uint32_t Ngram_next_words(const Ngram model, const uint32_t* context, uint32_t context_len, uint32_t next_word_limit, NextWordResult_T* rets){
    if (context_len == 0) {
        return 0;
    }
    uint32_t start = (context_len >= model->ngram_order) ? (context_len - model->ngram_order + 1): 0;
    uint32_t res_num = 0;
    for (uint32_t i = start; i < context_len; i++) {
        uint32_t cur_word_id = context[i];
        uint32_t next_word_start = model->uni_gram[cur_word_id].next_arr_idx;
        uint32_t next_word_end = model->uni_gram[cur_word_id+1].next_arr_idx;
        uint32_t next = -1;
        uint32_t ngram_idx = 0;
        for (uint32_t j = i+1; j < context_len;j++) {
            next = search_low_gram(context[j], model->low_grams[ngram_idx] + next_word_start, next_word_end - next_word_start);
            ngram_idx+=1;
            if (next == -1) {
                break;
            }else{
                next_word_start = model->low_grams[ngram_idx][next].next_arr_idx;
                next_word_end = model->low_grams[ngram_idx][next+1].next_arr_idx;
            }
        }
        if (next != -1) {
            //have found
            size_t arr_size = next_word_end - next_word_start;
            size_t arr_real_size = 0;
            NextWordResult_T* word_results = malloc(sizeof(NextWordResult_T)*arr_size);
            if (ngram_idx+2 != model->ngram_order) {
                //in low gram array
                for (size_t i = 0; i < arr_size; i++) {
                    LowGram_T* gram = &model->low_grams[ngram_idx][next_word_start+i];
                    if (gram->prob != (uint32_t)-1) {//srilm's bug
                        word_results[arr_real_size].word_id = gram->word; 
                        word_results[arr_real_size].prob = gram->prob;
                        arr_real_size++;
                    }
                }
            }else{
                //in high gram array
                for (size_t i = 0; i < arr_size; i++) {
                    HighGram_T* gram = &model->high_gram[next_word_start+i];
                    if (gram->prob != (uint32_t)-1) {
                        word_results[arr_real_size].word_id = gram->word; 
                        word_results[arr_real_size].prob = gram->prob;
                        arr_real_size++;
                    }
                }
            }
            qsort(word_results,arr_real_size, sizeof(NextWordResult_T), next_word_cmp);
            //copy to dst
            //if enough, then break
            for (size_t i = 0;i< arr_real_size;i++) {
                rets[res_num++] = word_results[i];
                if (res_num >= next_word_limit) {
                    free(word_results);
                    return next_word_limit;
                }
            }
            free(word_results);
        }
    }
    return res_num;
}